

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  SetMB *set;
  range<unsigned_long> *prVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  char *pcVar4;
  float fVar5;
  undefined4 uVar6;
  BBox1f BVar7;
  anon_class_16_2_aeee9775_conflict *paVar8;
  anon_class_1_0_00000001 *ptr;
  MemoryMonitorInterface *pMVar9;
  BBox1f BVar10;
  ThreadLocal2 *pTVar11;
  iterator iVar12;
  BBox1f *pBVar13;
  Split *pSVar14;
  Split *pSVar15;
  vint *pvVar16;
  size_t sVar17;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar32;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  uVar33;
  undefined8 uVar34;
  unsigned_long uVar35;
  BBox1f BVar36;
  BBox1f BVar37;
  BBox1f BVar38;
  vint vVar39;
  char cVar40;
  long *plVar41;
  MutexSys *pMVar42;
  ulong uVar43;
  long lVar44;
  void *pvVar45;
  float *pfVar46;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var47;
  size_t sVar48;
  runtime_error *prVar49;
  long lVar50;
  uint *puVar51;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar52;
  BBox1f *pBVar53;
  unsigned_long uVar54;
  size_t begin;
  SetMB *set_00;
  undefined8 uVar55;
  ulong uVar56;
  char *pcVar57;
  ulong uVar58;
  size_t end;
  byte bVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined8 uVar91;
  undefined8 uVar94;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  BuildRecord *in;
  BuildRecord *pBVar101;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  anon_class_24_3_c5d13451 isLeft;
  undefined4 uStack_1a40;
  undefined4 uStack_1a3c;
  undefined1 auStack_1a38 [8];
  undefined8 uStack_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1a18;
  BBox1f local_1a08;
  char acStack_1a00 [24];
  BBox1f local_19e8;
  BBox1f BStack_19e0;
  undefined4 uStack_19d8;
  undefined4 uStack_19d4;
  undefined4 uStack_19d0;
  undefined4 uStack_19cc;
  undefined1 auStack_19c8 [16];
  BBox1f local_19b8;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_1988;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1980;
  undefined1 auStack_1970 [8];
  anon_class_1_0_00000001 reduction;
  BBox1f BStack_1900;
  float fStack_18e0;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_18b8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18a8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1878;
  BBox1f local_1868;
  BBox1f BStack_1860;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1828;
  intrusive_list_node *piStack_1818;
  intrusive_list_node *piStack_1810;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_1808;
  void *pvStack_1800;
  string_resource_index sStack_17f8;
  char acStack_17f0 [8];
  char local_17e8 [8];
  char acStack_17e0 [8];
  char acStack_17d8 [8];
  char acStack_17d0 [8];
  BBox1f local_17c8;
  BBox1f BStack_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined1 auStack_17a8 [8];
  undefined8 uStack_17a0;
  BBox1f local_1798;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2;
  undefined4 uStack_1744;
  anon_class_1_0_00000001 reduction2_1;
  float fStack_16ac;
  undefined1 local_1698 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1678;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1668;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1658;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1648;
  unsigned_long uStack_1638;
  unsigned_long uStack_1630;
  BBox1f local_1628;
  size_t sStack_1620;
  BBox1f local_1618;
  BBox1f BStack_1610;
  undefined1 auStack_1608 [16];
  BBox1f local_15f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15e8;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  unsigned_long uStack_1598;
  unsigned_long uStack_1590;
  BBox1f local_1588;
  BBox1f BStack_1580;
  BBox1f local_1578;
  BBox1f BStack_1570;
  undefined1 auStack_1568 [16];
  BBox1f local_1558;
  vint vSplitPos_1;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_14c0;
  float fStack_14bc;
  size_t sStack_14b8;
  Split csplit;
  Lock<embree::MutexSys> lock;
  undefined1 auStack_13b8 [8];
  undefined8 uStack_13b0;
  undefined1 local_13a8 [8];
  undefined8 uStack_13a0;
  undefined1 auStack_1398 [8];
  BBox1f BStack_1390;
  undefined1 local_1388 [8];
  BBox1f BStack_1380;
  undefined1 auStack_1378 [8];
  undefined8 uStack_1370;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1368;
  BBox1f aBStack_1358 [2];
  float local_1348 [4];
  BBox1f local_1338;
  BBox1f BStack_1330;
  uint uStack_132c;
  BBox1f local_1328 [332];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  long local_838;
  BBox1f local_830;
  undefined8 local_828;
  BBox1f BStack_648;
  long local_640;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar41 = (long *)__tls_get_addr(&PTR_02224d38);
    pMVar42 = (MutexSys *)*plVar41;
    if (pMVar42 == (MutexSys *)0x0) {
      pMVar42 = (MutexSys *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys(pMVar42);
      pMVar42[1].mutex = (void *)0x0;
      pMVar42[8].mutex = pMVar42;
      pMVar42[9].mutex = (void *)0x0;
      pMVar42[10].mutex = (void *)0x0;
      pMVar42[0xb].mutex = (void *)0x0;
      pMVar42[0xc].mutex = (void *)0x0;
      pMVar42[0xb].mutex = (void *)0x0;
      pMVar42[0xc].mutex = (void *)0x0;
      pMVar42[0xd].mutex = (void *)0x0;
      pMVar42[0xe].mutex = (void *)0x0;
      pMVar42[0x10].mutex = pMVar42;
      pMVar42[0x11].mutex = (void *)0x0;
      pMVar42[0x12].mutex = (void *)0x0;
      pMVar42[0x13].mutex = (void *)0x0;
      pMVar42[0x14].mutex = (void *)0x0;
      pMVar42[0x13].mutex = (void *)0x0;
      pMVar42[0x14].mutex = (void *)0x0;
      pMVar42[0x15].mutex = (void *)0x0;
      pMVar42[0x16].mutex = (void *)0x0;
      *plVar41 = (long)pMVar42;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)pMVar42;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      if (values[0].ref.ptr != 0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)values,
                   (ThreadLocal2 *)values[0].ref.ptr);
      }
      if (lock.locked == true) {
        MutexSys::unlock(lock.mutex);
      }
    }
    alloc.talloc0 = (ThreadLocal *)(pMVar42 + 8);
    alloc.talloc1 = (ThreadLocal *)(pMVar42 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (uVar43 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     uVar43 <= (this->cfg).singleThreadThreshold)) {
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar43;
    auVar61 = vpunpckldq_avx(auVar61,_DAT_01fecac0);
    auVar61 = vsubpd_avx(auVar61,_DAT_01fecad0);
    Scene::progressMonitor((this->progressMonitor).scene,auVar61._0_8_ + auVar61._8_8_);
  }
  set = &current->prims;
  in = current;
  find(&csplit,this,set);
  bVar59 = (byte)(this->cfg).logBlockSize;
  sVar48 = (in->prims).super_PrimInfoMB.object_range._end;
  BVar7 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  uVar43 = sVar48 - (long)BVar7;
  if ((uVar43 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= in->depth + 8)) {
LAB_013f84fe:
    SetMB::deterministic_order(set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,in,alloc_00);
    return __return_storage_ptr__;
  }
  fVar60 = (in->prims).super_PrimInfoMB.time_range.lower;
  if (uVar43 <= (this->cfg).maxLeafSize) {
    auVar80 = vsubps_avx((undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds0.upper.field_0,
                         (undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds0.lower.field_0);
    auVar85 = vsubps_avx((undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds1.upper.field_0,
                         (undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds1.lower.field_0);
    auVar61 = vmovshdup_avx(auVar80);
    auVar69 = vshufpd_avx(auVar80,auVar80,1);
    auVar68 = vmovshdup_avx(auVar85);
    auVar70 = vshufpd_avx(auVar85,auVar85,1);
    fVar90 = ((in->prims).super_PrimInfoMB.time_range.upper - fVar60) *
             ((auVar61._0_4_ + auVar69._0_4_) * auVar80._0_4_ + auVar61._0_4_ * auVar69._0_4_ +
             (auVar68._0_4_ + auVar70._0_4_) * auVar85._0_4_ + auVar68._0_4_ * auVar70._0_4_) * 0.5;
    fVar5 = (this->cfg).intCost;
    if (fVar5 * fVar90 * (float)(~(-1L << (bVar59 & 0x3f)) +
                                 (current->prims).super_PrimInfoMB.num_time_segments >>
                                (bVar59 & 0x3f)) <=
        fVar90 * (this->cfg).travCost + fVar5 * csplit.sah) goto LAB_013f84fe;
  }
  if (csplit.data == 0) {
    lock.mutex = (MutexSys *)0x7f8000007f800000;
    lock.locked = false;
    lock._9_3_ = 0x7f8000;
    lock._12_4_ = 0x7f800000;
    uStack_13b0._0_4_ = -INFINITY;
    auStack_13b8 = (undefined1  [8])0xff800000ff800000;
    uStack_13b0._4_4_ = 0xff800000;
    uStack_13a0._0_4_ = INFINITY;
    local_13a8 = (undefined1  [8])0x7f8000007f800000;
    uStack_13a0._4_4_ = 0x7f800000;
    BStack_1390.lower = -INFINITY;
    auStack_1398 = (undefined1  [8])0xff800000ff800000;
    BStack_1390.upper = -INFINITY;
    BStack_1380.lower = INFINITY;
    local_1388 = (undefined1  [8])0x7f8000007f800000;
    BStack_1380.upper = INFINITY;
    uStack_1370._0_4_ = -INFINITY;
    auStack_1378 = (undefined1  [8])0xff800000ff800000;
    uStack_1370._4_4_ = 0xff800000;
    local_1368 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    aBStack_1358[0].lower = 0.0;
    aBStack_1358[0].upper = 0.0;
    aBStack_1358[1].lower = 0.0;
    aBStack_1358[1].upper = 0.0;
    local_1348[0] = 0.0;
    auVar86._8_4_ = 0x3f800000;
    auVar86._0_8_ = &DAT_3f8000003f800000;
    auVar86._12_4_ = 0x3f800000;
    uVar55 = vmovlps_avx(auVar86);
    local_1348[1] = (float)uVar55;
    local_1348[2] = (float)((ulong)uVar55 >> 0x20);
    local_1348[3] = 0.0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    uVar55 = vmovlps_avx(auVar86);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar55;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar55 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    auVar31._4_4_ = 0;
    auVar31._0_4_ = csplit.field_2.pos;
    auVar31._8_8_ = csplit.mapping.num;
    vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar31,0);
    isLeft.vSplitPos = &vSplitPos;
    lVar50 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar50);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar50 + 8);
    isLeft.vSplitMask = &vSplitMask;
    pBVar101 = in;
    isLeft.split = &csplit;
    local_1628 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                   (((in->prims).prims)->items,(size_t)BVar7,sVar48,
                                    (EmptyTy *)&vSplitPos_1,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,
                                    &reduction,&reduction2,0x80,0xc00);
    local_15f8 = (BBox1f)(in->prims).prims;
    auVar62._8_8_ = 0;
    auVar62._0_4_ = (in->prims).super_PrimInfoMB.time_range.lower;
    auVar62._4_4_ = (in->prims).super_PrimInfoMB.time_range.upper;
    local_15e8._8_8_ = CONCAT44(lock._12_4_,lock._8_4_);
    local_15e8._0_8_ = lock.mutex;
    uStack_15d8 = auStack_13b8;
    uStack_15d0 = uStack_13b0;
    local_15c8 = local_13a8;
    uStack_15c0 = uStack_13a0;
    uStack_15b8 = auStack_1398;
    uStack_15b0._0_4_ = BStack_1390.lower;
    uStack_15b0._4_4_ = BStack_1390.upper;
    local_15a8 = local_1388;
    uStack_15a0._0_4_ = BStack_1380.lower;
    uStack_15a0._4_4_ = BStack_1380.upper;
    uStack_1598 = (unsigned_long)auStack_1378;
    uStack_1590 = uStack_1370;
    auStack_1568._4_4_ = local_1348[1];
    auStack_1568._0_4_ = local_1348[0];
    auVar73._4_4_ = local_1348[3];
    auVar73._0_4_ = local_1348[2];
    local_1578 = aBStack_1358[0];
    BStack_1570 = aBStack_1358[1];
    auVar73._8_8_ = 0;
    auVar61 = vcmpps_avx(auVar73,auVar62,1);
    auVar68 = vinsertps_avx(auVar62,auVar73,0x50);
    auVar69 = vinsertps_avx(auVar73,auVar62,0x50);
    auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
    auStack_1568._8_8_ = vmovlps_avx(auVar61);
    local_1698._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    local_1698._16_8_ = values[0].ref.ptr;
    aStack_1678._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[1],
                  values[0].lbounds.bounds0.lower.field_0.m128[0]);
    aStack_1678._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[3],
                  values[0].lbounds.bounds0.lower.field_0.m128[2]);
    local_1668._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[1],
                  values[0].lbounds.bounds0.upper.field_0.m128[0]);
    local_1668._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[3],
                  values[0].lbounds.bounds0.upper.field_0.m128[2]);
    aStack_1658._0_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[1],
                  values[0].lbounds.bounds1.lower.field_0.m128[0]);
    aStack_1658._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[3],
                  values[0].lbounds.bounds1.lower.field_0.m128[2]);
    local_1648._4_4_ = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_1648._0_4_ = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_1648._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.upper.field_0.m128[3],
                  values[0].lbounds.bounds1.upper.field_0.m128[2]);
    uStack_1638 = CONCAT44(values[0].dt.upper,values[0].dt.lower);
    uStack_1630 = CONCAT44(values[0]._92_4_,values[0]._88_4_);
    auStack_1608._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auStack_1608._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar74._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar74._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    auVar74._8_8_ = 0;
    auVar61 = vcmpps_avx(auVar74,auVar62,1);
    auVar68 = vinsertps_avx(auVar62,auVar74,0x50);
    auVar69 = vinsertps_avx(auVar74,auVar62,0x50);
    auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
    auStack_1608._8_8_ = vmovlps_avx(auVar61);
    in = pBVar101;
    sStack_1620 = sVar48;
    local_1588 = BVar7;
    BStack_1580 = local_1628;
    local_1558 = local_15f8;
LAB_013f8804:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  }
  else {
    if (csplit.data != 2) {
      if (csplit.data == 1) {
        SetMB::deterministic_order(set);
        splitFallback(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      else if (csplit.data == 3) {
        SetMB::deterministic_order(set);
        splitByGeometry(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      goto LAB_013f8804;
    }
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = (in->prims).super_PrimInfoMB.time_range.upper;
    time_range1.lower = csplit.field_2.fpos;
    BVar7 = (BBox1f)(in->prims).prims;
    time_range0.lower = fVar60;
    _Var47.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )operator_new(0x28);
    pMVar9 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var47.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar9;
    *(undefined1 *)
     ((long)_Var47.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    uVar56 = uVar43 * 0x50;
    *(long *)((long)_Var47.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var47.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var47.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar56,0);
    if (uVar56 < 0x1c00000) {
      pvVar45 = alignedMalloc(uVar56,0x10);
    }
    else {
      pvVar45 = os_malloc(uVar56,(bool *)((long)_Var47.
                                                super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                .
                                                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                ._M_head_impl + 8));
    }
    aStack_18b8._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var47.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar45;
    *(ulong *)((long)_Var47.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar43;
    *(ulong *)((long)_Var47.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar43;
    aStack_18b8._8_8_ = &lprims;
    pSVar14 = (Split *)(in->prims).super_PrimInfoMB.object_range._begin;
    pvVar16 = (vint *)(in->prims).super_PrimInfoMB.object_range._end;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = &DAT_3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    uVar55 = vmovlps_avx(auVar68);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar55;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar55 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var47.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var47.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar7;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar16 - (long)pSVar14) < 0xc00) {
      isLeft.split = pSVar14;
      isLeft.vSplitPos = pvVar16;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)&lock,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      vSplitPos.field_0.v[1] = (longlong)pSVar14;
      vSplitPos.field_0.v[0] = (longlong)pvVar16;
      local_1828._0_8_ = (BBox1f *)0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)values,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,(task_group_context *)in);
      cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar40 != '\0') {
        prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar49,"task cancelled");
        __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    uVar54 = (in->prims).super_PrimInfoMB.object_range._end -
             (in->prims).super_PrimInfoMB.object_range._begin;
    if (local_1368._8_8_ - local_1368._0_8_ != uVar54) {
      values[0].ref.ptr = (size_t)&time_range0;
      local_1368._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                     (lprims->items,0,uVar54,0x400,(anon_class_8_1_41ce32a5 *)values);
    }
    aVar24 = local_1368;
    auVar69._4_4_ = time_range0.upper;
    auVar69._0_4_ = time_range0.lower;
    auVar69._8_8_ = 0;
    local_15e8._8_8_ = CONCAT44(lock._12_4_,lock._8_4_);
    local_1578 = aBStack_1358[0];
    BStack_1570 = aBStack_1358[1];
    local_15e8._0_8_ = lock.mutex;
    uStack_15d8 = auStack_13b8;
    uStack_15d0 = uStack_13b0;
    local_15c8 = local_13a8;
    uStack_15c0 = uStack_13a0;
    uStack_15b8 = auStack_1398;
    uStack_15b0._0_4_ = BStack_1390.lower;
    uStack_15b0._4_4_ = BStack_1390.upper;
    local_15a8 = local_1388;
    uStack_15a0._0_4_ = BStack_1380.lower;
    uStack_15a0._4_4_ = BStack_1380.upper;
    uStack_1598 = (unsigned_long)auStack_1378;
    uStack_1590 = uStack_1370;
    local_1588.lower = local_1368.m128[0];
    local_1588.upper = local_1368.m128[1];
    local_1368._8_8_ = aVar24._8_8_;
    BStack_1580.lower = local_1368.m128[2];
    BStack_1580.upper = local_1368.m128[3];
    auVar80._4_4_ = local_1348[1];
    auVar80._0_4_ = local_1348[0];
    auVar80._8_8_ = 0;
    auVar85._4_4_ = local_1348[3];
    auVar85._0_4_ = local_1348[2];
    auVar85._8_8_ = 0;
    auVar61 = vcmpps_avx(auVar85,auVar69,1);
    auVar68 = vinsertps_avx(auVar69,auVar85,0x50);
    auVar69 = vinsertps_avx(auVar85,auVar69,0x50);
    auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
    auStack_1568 = vmovlhps_avx(auVar80,auVar61);
    local_1558 = (BBox1f)lprims;
    prVar1 = &(in->prims).super_PrimInfoMB.object_range;
    pBVar53 = (BBox1f *)(in->prims).super_PrimInfoMB.object_range._end;
    aVar32._0_8_ = prVar1->_begin;
    aVar32._8_8_ = prVar1->_end;
    isLeft.split = (Split *)0x7f8000007f800000;
    isLeft.vSplitPos = (vint *)0x7f8000007f800000;
    isLeft.vSplitMask._0_4_ = 0xff800000;
    isLeft.vSplitMask._4_4_ = 0xff800000;
    uStack_1a40 = -INFINITY;
    uStack_1a3c = -INFINITY;
    uStack_1a30._0_4_ = INFINITY;
    auStack_1a38 = (undefined1  [8])0x7f8000007f800000;
    uStack_1a30._4_4_ = 0x7f800000;
    local_1a28._0_8_ = (SetMB *)0xff800000ff800000;
    local_1a28.m128[2] = -INFINITY;
    local_1a28.m128[3] = -INFINITY;
    aStack_1a18.m128[0] = INFINITY;
    aStack_1a18.m128[1] = INFINITY;
    aStack_1a18.m128[2] = INFINITY;
    aStack_1a18.m128[3] = INFINITY;
    local_1a08.lower = -INFINITY;
    local_1a08.upper = -INFINITY;
    acStack_1a00[0] = '\0';
    acStack_1a00[1] = '\0';
    acStack_1a00[2] = -0x80;
    acStack_1a00[3] = -1;
    acStack_1a00[4] = '\0';
    acStack_1a00[5] = '\0';
    acStack_1a00[6] = -0x80;
    acStack_1a00[7] = -1;
    acStack_1a00[8] = '\0';
    acStack_1a00[9] = '\0';
    acStack_1a00[10] = '\0';
    acStack_1a00[0xb] = '\0';
    acStack_1a00[0xc] = '\0';
    acStack_1a00[0xd] = '\0';
    acStack_1a00[0xe] = '\0';
    acStack_1a00[0xf] = '\0';
    acStack_1a00[0x10] = '\0';
    acStack_1a00[0x11] = '\0';
    acStack_1a00[0x12] = '\0';
    acStack_1a00[0x13] = '\0';
    acStack_1a00[0x14] = '\0';
    acStack_1a00[0x15] = '\0';
    acStack_1a00[0x16] = '\0';
    acStack_1a00[0x17] = '\0';
    local_19e8.lower = 0.0;
    local_19e8.upper = 0.0;
    BStack_19e0.lower = 0.0;
    BStack_19e0.upper = 0.0;
    uStack_19d8 = 0;
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = &DAT_3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    uVar55 = vmovlps_avx(auVar70);
    uStack_19d4 = (undefined4)uVar55;
    uStack_19d0 = (undefined4)((ulong)uVar55 >> 0x20);
    uStack_19cc = 0;
    _reduction2 = BVar7;
    local_1368 = aVar24;
    if ((long)pBVar53 - prVar1->_begin < 0xc00) {
      vSplitPos.field_0 = aVar32;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)values,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      vSplitPos.field_0.v[1]._4_2_ = 0x401;
      piStack_1818 = (intrusive_list_node *)0x0;
      piStack_1810 = (intrusive_list_node *)0x0;
      sStack_17f8 = CUSTOM_CTX;
      tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      _reduction = (code *)pBVar53;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&isLeft,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,(task_group_context *)in);
      cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar40 != '\0') {
        prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar49,"task cancelled");
        __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
    }
    lVar50 = values[1]._8_8_ - values[1].ref.ptr;
    values[1].ref.ptr = (in->prims).super_PrimInfoMB.object_range._begin;
    values[1]._8_8_ = lVar50 + values[1].ref.ptr;
    uVar54 = (in->prims).super_PrimInfoMB.object_range._end;
    if (lVar50 != uVar54 - values[1].ref.ptr) {
      isLeft.split = (Split *)&time_range1;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                     ((PrimRefMB *)
                      ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar7 + 0x20))->reduction,
                      values[1].ref.ptr,uVar54,0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
    }
    auVar71._8_8_ = 0;
    auVar71._0_4_ = time_range1.lower;
    auVar71._4_4_ = time_range1.upper;
    local_1698._16_8_ = values[0].ref.ptr;
    local_1698._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    aStack_1678._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[1],
                  values[0].lbounds.bounds0.lower.field_0.m128[0]);
    aStack_1678._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[3],
                  values[0].lbounds.bounds0.lower.field_0.m128[2]);
    local_1668._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[1],
                  values[0].lbounds.bounds0.upper.field_0.m128[0]);
    local_1668._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[3],
                  values[0].lbounds.bounds0.upper.field_0.m128[2]);
    aStack_1658._0_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[1],
                  values[0].lbounds.bounds1.lower.field_0.m128[0]);
    aStack_1658._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[3],
                  values[0].lbounds.bounds1.lower.field_0.m128[2]);
    local_1648._4_4_ = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_1648._0_4_ = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_1648._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.upper.field_0.m128[3],
                  values[0].lbounds.bounds1.upper.field_0.m128[2]);
    uStack_1638 = CONCAT44(values[0].dt.upper,values[0].dt.lower);
    uStack_1630 = CONCAT44(values[0]._92_4_,values[0]._88_4_);
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    local_1628.lower = (float)(undefined4)values[1].ref.ptr;
    local_1628.upper = (float)values[1].ref.ptr._4_4_;
    sStack_1620 = values[1]._8_8_;
    auVar81._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar81._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    auVar81._8_8_ = 0;
    auVar61 = vcmpps_avx(auVar81,auVar71,1);
    auVar68 = vinsertps_avx(auVar71,auVar81,0x50);
    auVar69 = vinsertps_avx(auVar81,auVar71,0x50);
    auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
    auVar82._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auVar82._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar82._8_8_ = 0;
    auStack_1608 = vmovlhps_avx(auVar82,auVar61);
    local_18a8._0_8_ = set;
    local_15f8 = BVar7;
  }
  BVar38 = local_1558;
  BVar37 = BStack_1580;
  BVar36 = local_1588;
  BVar10 = local_15f8;
  auVar61 = auStack_1608;
  uVar35 = uStack_1630;
  uVar54 = uStack_1638;
  bVar59 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )new_vector._M_t.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl !=
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  local_848 = 1;
  local_640 = 1;
  pMVar42 = (MutexSys *)in->depth;
  _auStack_13b8 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
       bounds0.lower.field_0;
  _local_13a8 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0;
  _auStack_1398 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
       bounds1.lower.field_0;
  _local_1388 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0;
  _auStack_1378 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0;
  local_1368 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               centBounds.upper.field_0;
  aBStack_1358[0] = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  aBStack_1358[1] = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  sVar48 = (in->prims).super_PrimInfoMB.num_time_segments;
  sVar17 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  local_1348[0] = (float)sVar48;
  local_1348[1] = (float)(sVar48 >> 0x20);
  local_1348[2] = (float)sVar17;
  local_1348[3] = (float)(sVar17 >> 0x20);
  local_1338 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1330 = (in->prims).super_PrimInfoMB.time_range;
  BVar7 = (BBox1f)(in->prims).prims;
  local_840 = BVar7;
  local_838 = 2;
  aVar24._8_8_ = local_15e8._8_8_;
  aVar24._0_8_ = local_15e8._0_8_;
  aVar25._8_8_ = uStack_15d0;
  aVar25._0_8_ = uStack_15d8;
  aVar26._8_8_ = uStack_15c0;
  aVar26._0_8_ = local_15c8;
  aVar27._8_8_ = uStack_15b0;
  aVar27._0_8_ = uStack_15b8;
  aVar28._8_8_ = uStack_15a0;
  aVar28._0_8_ = local_15a8;
  aVar29._8_8_ = uStack_1590;
  aVar29._0_8_ = uStack_1598;
  isLeft.split = (Split *)local_1578;
  isLeft.vSplitPos = (vint *)BStack_1570;
  uVar55 = auStack_1568._0_8_;
  uVar34 = auStack_1568._8_8_;
  auVar19._8_8_ = local_1698._24_8_;
  auVar19._0_8_ = local_1698._16_8_;
  auVar20._8_8_ = aStack_1678._8_8_;
  auVar20._0_8_ = aStack_1678._0_8_;
  auVar21._8_8_ = local_1668._8_8_;
  auVar21._0_8_ = local_1668._0_8_;
  auVar22._8_8_ = aStack_1658._8_8_;
  auVar22._0_8_ = aStack_1658._0_8_;
  auVar23._8_8_ = sStack_1620;
  auVar23._0_4_ = local_1628.lower;
  auVar23._4_4_ = local_1628.upper;
  vSplitPos.field_0._8_4_ = BStack_1610.lower;
  vSplitPos.field_0._12_4_ = BStack_1610.upper;
  vSplitPos.field_0._0_4_ = local_1618.lower;
  vSplitPos.field_0._4_4_ = local_1618.upper;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_1558 == BVar7) {
    local_8c8[0] = &local_840;
    local_838 = 3;
  }
  else {
    local_640 = 2;
    local_830 = local_1558;
    local_828 = 1;
    local_8c8[0] = &local_830;
  }
  lVar50 = local_640;
  if (local_15f8 == BVar7) {
    local_8c8[1] = &local_840;
    local_838 = local_838 + 1;
  }
  else {
    local_640 = local_640 + 1;
    (&local_840)[lVar50 * 2] = local_15f8;
    (&local_838)[lVar50 * 2] = 1;
    local_8c8[1] = &local_840 + lVar50 * 2;
  }
  local_838 = local_838 + -1;
  uVar91 = local_1648._0_8_;
  uVar94 = local_1648._8_8_;
  if ((local_838 == 0) && (BVar7 != (BBox1f)0x0)) {
    local_1980._8_8_ = local_1648._0_8_;
    auStack_1970 = (undefined1  [8])local_1648._8_8_;
    paVar8 = *(anon_class_16_2_aeee9775_conflict **)((long)BVar7 + 0x18);
    ptr = ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar7 + 0x20))->reduction;
    lock.mutex = pMVar42;
    local_1328[0] = BVar7;
    if (ptr != (anon_class_1_0_00000001 *)0x0) {
      if ((ulong)((long)paVar8 * 0x50) < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,(long)paVar8 * 0x50,*(bool *)((long)BVar7 + 8));
      }
    }
    if (paVar8 != (anon_class_16_2_aeee9775_conflict *)0x0) {
      (**(code **)**(undefined8 **)BVar7)(*(undefined8 **)BVar7,(long)paVar8 * -0x50,1);
    }
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar7 + 0x10))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    *(anon_class_16_2_aeee9775_conflict **)((long)BVar7 + 0x18) =
         (anon_class_16_2_aeee9775_conflict *)0x0;
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar7 + 0x20))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    operator_delete((void *)BVar7);
    uVar91 = local_1980._8_8_;
    uVar94 = auStack_1970;
  }
  uVar43 = local_848;
  auVar68 = auStack_1568;
  lock.mutex = (MutexSys *)((long)&pMVar42->mutex + 1);
  _auStack_13b8 = aVar24;
  _local_13a8 = aVar25;
  _auStack_1398 = aVar26;
  _local_1388 = aVar27;
  _auStack_1378 = aVar28;
  local_1368 = aVar29;
  aBStack_1358[0] = BVar36;
  aBStack_1358[1] = BVar37;
  local_1348[0] = SUB84(isLeft.split,0);
  local_1348[1] = (float)((ulong)isLeft.split >> 0x20);
  local_1348[2] = SUB84(isLeft.vSplitPos,0);
  local_1348[3] = (float)((ulong)isLeft.vSplitPos >> 0x20);
  auStack_1568._0_4_ = (undefined4)uVar55;
  auStack_1568._4_4_ = SUB84(uVar55,4);
  local_1338.lower = (float)auStack_1568._0_4_;
  local_1338.upper = (float)auStack_1568._4_4_;
  BStack_1330 = (BBox1f)uVar34;
  local_1328[0] = BVar38;
  lVar50 = local_848 * 0xb0;
  *(MutexSys **)(auStack_13b8 + lVar50 + -0x10) = lock.mutex;
  *(undefined1 (*) [16])(auStack_13b8 + lVar50) = auVar19;
  *(undefined1 (*) [16])(local_13a8 + lVar50) = auVar20;
  *(undefined1 (*) [16])(auStack_1398 + lVar50) = auVar21;
  *(undefined1 (*) [16])(local_1388 + lVar50) = auVar22;
  *(undefined8 *)(auStack_1378 + lVar50) = uVar91;
  *(undefined8 *)(auStack_1378 + lVar50 + 8) = uVar94;
  *(unsigned_long *)(&local_1368 + uVar43 * 0xb) = uVar54;
  *(unsigned_long *)((long)&local_1368 + lVar50 + 8) = uVar35;
  *(undefined1 (*) [16])(aBStack_1358 + uVar43 * 0x16) = auVar23;
  *(longlong *)(local_1348 + uVar43 * 0x2c) = vSplitPos.field_0.v[0];
  *(longlong *)(local_1348 + uVar43 * 0x2c + 2) = vSplitPos.field_0.v[1];
  *(undefined1 (*) [16])(&local_1338 + uVar43 * 0x16) = auVar61;
  local_1328[uVar43 * 0x16] = BVar10;
  local_848 = local_848 + 1;
  local_1a88._8_4_ = 0x7f800000;
  local_1a88._0_8_ = 0x7f8000007f800000;
  local_1a88._12_4_ = 0x7f800000;
  local_1a98._8_4_ = 0xff800000;
  local_1a98._0_8_ = 0xff800000ff800000;
  local_1a98._12_4_ = 0xff800000;
  auStack_1568 = auVar68;
  do {
    if ((this->cfg).branchingFactor <= local_848) break;
    if (local_848 == 0) {
      uVar43 = 0xffffffffffffffff;
    }
    else {
      uVar43 = 0xffffffffffffffff;
      pBVar53 = aBStack_1358 + 1;
      fVar60 = -INFINITY;
      uVar56 = 0;
      do {
        if ((this->cfg).minLeafSize < (ulong)((long)*pBVar53 - (long)pBVar53[-1])) {
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(pBVar53 + -0xb),
                               *(undefined1 (*) [16])(pBVar53 + -0xd));
          auVar70 = vsubps_avx(*(undefined1 (*) [16])(pBVar53 + -7),
                               *(undefined1 (*) [16])(pBVar53 + -9));
          auVar61 = vinsertps_avx(auVar70,auVar69,0x4c);
          auVar68 = vshufpd_avx(auVar69,auVar69,1);
          auVar68 = vinsertps_avx(auVar68,auVar70,0x9c);
          auVar69 = vinsertps_avx(auVar69,auVar70,0x1c);
          auVar75._0_4_ =
               auVar69._0_4_ * (auVar61._0_4_ + auVar68._0_4_) + auVar61._0_4_ * auVar68._0_4_;
          auVar75._4_4_ =
               auVar69._4_4_ * (auVar61._4_4_ + auVar68._4_4_) + auVar61._4_4_ * auVar68._4_4_;
          auVar75._8_4_ =
               auVar69._8_4_ * (auVar61._8_4_ + auVar68._8_4_) + auVar61._8_4_ * auVar68._8_4_;
          auVar75._12_4_ =
               auVar69._12_4_ * (auVar61._12_4_ + auVar68._12_4_) + auVar61._12_4_ * auVar68._12_4_;
          auVar61 = vhaddps_avx(auVar75,auVar75);
          fVar5 = auVar61._0_4_ * 0.5;
          if (fVar60 < fVar5) {
            uVar43 = uVar56;
            fVar60 = fVar5;
          }
        }
        uVar56 = uVar56 + 1;
        pBVar53 = pBVar53 + 0x16;
      } while (local_848 != uVar56);
    }
    if (uVar43 != 0xffffffffffffffff) {
      lVar50 = uVar43 * 0xb0;
      isLeft.split = (Split *)(in->depth + 1);
      vSplitPos.field_0.v[0] = (longlong)isLeft.split;
      set_00 = (SetMB *)(auStack_13b8 + lVar50);
      find((Split *)&time_range0,this,set_00);
      if (fStack_14bc == 0.0) {
        local_19e8 = aBStack_1358[uVar43 * 0x16];
        BVar7 = aBStack_1358[uVar43 * 0x16 + 1];
        vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
        vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
        aStack_18b8._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        aStack_18b8._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_18a8._0_8_ = (SetMB *)0x7f8000007f800000;
        local_18a8.i[2] = 0x7f800000;
        local_18a8.i[3] = 0x7f800000;
        aStack_1898.i[0] = -0x800000;
        aStack_1898.i[1] = -0x800000;
        aStack_1898.i[2] = -0x800000;
        aStack_1898.i[3] = -0x800000;
        local_1888.m128[0] = INFINITY;
        local_1888.m128[1] = INFINITY;
        local_1888.m128[2] = INFINITY;
        local_1888.m128[3] = INFINITY;
        aStack_1878.m128[0] = -INFINITY;
        aStack_1878.m128[1] = -INFINITY;
        aStack_1878.m128[2] = -INFINITY;
        aStack_1878.m128[3] = -INFINITY;
        local_1848 = 0.0;
        local_1868.lower = 0.0;
        local_1868.upper = 0.0;
        BStack_1860.lower = 0.0;
        BStack_1860.upper = 0.0;
        auVar87._8_4_ = 0x3f800000;
        auVar87._0_8_ = &DAT_3f8000003f800000;
        auVar87._12_4_ = 0x3f800000;
        uVar55 = vmovlps_avx(auVar87);
        fStack_1844 = (float)uVar55;
        fStack_1840 = (float)((ulong)uVar55 >> 0x20);
        fStack_183c = 0.0;
        _reduction = (code *)0x7f8000007f800000;
        vmovlps_avx(auVar87);
        auVar30._4_4_ = 0;
        auVar30._0_4_ = local_14c0.pos;
        auVar30._8_8_ = sStack_14b8;
        vSplitPos_1.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar30,0);
        time_range1 = *(BBox1f *)
                       (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
        _reduction2 = &time_range0;
        BStack_19e0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1328[uVar43 * 0x16] + 0x20),
                                         (size_t)local_19e8,(size_t)BVar7,(EmptyTy *)local_1698,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                                         (anon_class_24_3_c5d13451 *)&reduction2,
                                         (anon_class_1_0_00000001 *)&lprims,&reduction2_1,0x80,0xc00
                                        );
        local_19b8 = local_1328[uVar43 * 0x16];
        auVar63._8_8_ = 0;
        auVar63._0_4_ = local_1328[uVar43 * 0x16 + -1].lower;
        auVar63._4_4_ = local_1328[uVar43 * 0x16 + -1].upper;
        local_1a28.m128[2] = INFINITY;
        local_1a28.m128[3] = INFINITY;
        aStack_1a18.m128[0] = -INFINITY;
        aStack_1a18.m128[1] = -INFINITY;
        aStack_1a18.m128[2] = -INFINITY;
        aStack_1a18.m128[3] = -INFINITY;
        local_1a08.lower = INFINITY;
        local_1a08.upper = INFINITY;
        acStack_1a00[0] = '\0';
        acStack_1a00[1] = '\0';
        acStack_1a00[2] = -0x80;
        acStack_1a00[3] = '\x7f';
        acStack_1a00[4] = '\0';
        acStack_1a00[5] = '\0';
        acStack_1a00[6] = -0x80;
        acStack_1a00[7] = '\x7f';
        acStack_1a00[8] = '\0';
        acStack_1a00[9] = '\0';
        acStack_1a00[10] = -0x80;
        acStack_1a00[0xb] = -1;
        acStack_1a00[0xc] = '\0';
        acStack_1a00[0xd] = '\0';
        acStack_1a00[0xe] = -0x80;
        acStack_1a00[0xf] = -1;
        acStack_1a00[0x10] = '\0';
        acStack_1a00[0x11] = '\0';
        acStack_1a00[0x12] = -0x80;
        acStack_1a00[0x13] = -1;
        acStack_1a00[0x14] = '\0';
        acStack_1a00[0x15] = '\0';
        acStack_1a00[0x16] = -0x80;
        acStack_1a00[0x17] = -1;
        uStack_1a40 = (undefined4)vSplitMask.field_0._8_8_;
        uStack_1a3c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
        uStack_1a30 = 0xff800000ff800000;
        auStack_1a38 = (undefined1  [8])0xff800000ff800000;
        local_1a28._0_8_ = (SetMB *)0x7f8000007f800000;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = auStack_19c8._8_8_;
        auVar61 = vcmpps_avx(auVar76,auVar63,1);
        auVar68 = vinsertps_avx(auVar63,auVar76,0x50);
        auVar69 = vinsertps_avx(auVar76,auVar63,0x50);
        auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
        uVar55 = vmovlps_avx(auVar61);
        auStack_19c8._8_8_ = uVar55;
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1818 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        sStack_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        local_17e8[0] = '\0';
        local_17e8[1] = '\0';
        local_17e8[2] = -0x80;
        local_17e8[3] = '\x7f';
        local_17e8[4] = '\0';
        local_17e8[5] = '\0';
        local_17e8[6] = -0x80;
        local_17e8[7] = '\x7f';
        acStack_17e0[0] = '\0';
        acStack_17e0[1] = '\0';
        acStack_17e0[2] = -0x80;
        acStack_17e0[3] = '\x7f';
        acStack_17e0[4] = '\0';
        acStack_17e0[5] = '\0';
        acStack_17e0[6] = -0x80;
        acStack_17e0[7] = '\x7f';
        acStack_17d8[0] = '\0';
        acStack_17d8[1] = '\0';
        acStack_17d8[2] = -0x80;
        acStack_17d8[3] = -1;
        acStack_17d8[4] = '\0';
        acStack_17d8[5] = '\0';
        acStack_17d8[6] = -0x80;
        acStack_17d8[7] = -1;
        acStack_17d0[0] = '\0';
        acStack_17d0[1] = '\0';
        acStack_17d0[2] = -0x80;
        acStack_17d0[3] = -1;
        acStack_17d0[4] = '\0';
        acStack_17d0[5] = '\0';
        acStack_17d0[6] = -0x80;
        acStack_17d0[7] = -1;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uStack_17a0;
        auVar61 = vcmpps_avx(auVar77,auVar63,1);
        auVar68 = vinsertps_avx(auVar63,auVar77,0x50);
        auVar69 = vinsertps_avx(auVar77,auVar63,0x50);
        auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
        uVar55 = vmovlps_avx(auVar61);
        uStack_17a0 = uVar55;
        local_17c8 = BStack_19e0;
        BStack_17c0 = BVar7;
        local_1798 = local_19b8;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
LAB_013f9131:
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        if (fStack_14bc != 2.8026e-45) {
          if (fStack_14bc == 1.4013e-45) {
            SetMB::deterministic_order(set_00);
            splitFallback(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          else if (fStack_14bc == 4.2039e-45) {
            SetMB::deterministic_order(set_00);
            splitByGeometry(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          goto LAB_013f9131;
        }
        time_range0_1.lower = local_1328[uVar43 * 0x16 + -1].lower;
        time_range0_1.upper = local_14c0.fpos;
        time_range1_1.lower = local_14c0.fpos;
        time_range1_1.upper = local_1328[uVar43 * 0x16 + -1].upper;
        local_1980._8_8_ = local_1328[uVar43 * 0x16];
        local_19b8 = (BBox1f)operator_new(0x28);
        pMVar9 = (this->heuristicTemporalSplit).device;
        BVar7 = aBStack_1358[uVar43 * 0x16 + 1];
        *(MemoryMonitorInterface **)local_19b8 = pMVar9;
        *(undefined1 *)((long)local_19b8 + 8) = 0;
        *(long *)((long)local_19b8 + 0x10) = 0;
        *(long *)((long)local_19b8 + 0x18) = 0;
        *(long *)((long)local_19b8 + 0x20) = 0;
        lVar44 = (long)BVar7 - (long)aBStack_1358[uVar43 * 0x16];
        if (lVar44 != 0) {
          uVar56 = lVar44 * 0x50;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar56,0);
          if (uVar56 < 0x1c00000) {
            pvVar45 = alignedMalloc(uVar56,0x10);
          }
          else {
            pvVar45 = os_malloc(uVar56,(bool *)((long)local_19b8 + 8));
          }
          *(void **)((long)local_19b8 + 0x20) = pvVar45;
          *(long *)((long)local_19b8 + 0x10) = lVar44;
          *(long *)((long)local_19b8 + 0x18) = lVar44;
        }
        time_range1.lower = local_1980.m128[2];
        time_range1.upper = local_1980.m128[3];
        BVar7 = aBStack_1358[uVar43 * 0x16];
        BVar10 = aBStack_1358[uVar43 * 0x16 + 1];
        _reduction = (code *)0x7f8000007f800000;
        auVar64._8_4_ = 0x3f800000;
        auVar64._0_8_ = &DAT_3f8000003f800000;
        auVar64._12_4_ = 0x3f800000;
        lVar44 = vmovlps_avx(auVar64);
        fStack_18e0 = (float)((ulong)lVar44 >> 0x20);
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_19b8;
        if ((ulong)((long)BVar10 - (long)BVar7) < 0xc00) {
          _reduction2 = BVar7;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&vSplitMask,(anon_class_40_5_808acc65 *)&time_range1,
                     (range<unsigned_long> *)&reduction2);
        }
        else {
          tbb::detail::r1::initialize((task_group_context *)&reduction2);
          vSplitPos_1.field_0._8_4_ = BVar7.lower;
          vSplitPos_1.field_0._12_4_ = BVar7.upper;
          vSplitPos_1.field_0._0_4_ = BVar10.lower;
          vSplitPos_1.field_0._4_4_ = BVar10.upper;
          lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1988 = &time_range1;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,(d1 *)&vSplitPos_1,
                     (blocked_range<unsigned_long> *)&reduction,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&reduction2,(task_group_context *)in);
          cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
          if (cVar40 != '\0') {
            prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar49,"task cancelled");
            __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&reduction2);
        }
        uVar55 = local_1980._8_8_;
        if ((long)BStack_1860 - (long)local_1868 !=
            (long)aBStack_1358[uVar43 * 0x16 + 1] - (long)aBStack_1358[uVar43 * 0x16]) {
          _reduction = (code *)&time_range0_1;
          BStack_1860 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_19b8 + 0x20),0,
                                           (long)aBStack_1358[uVar43 * 0x16 + 1] -
                                           (long)aBStack_1358[uVar43 * 0x16],0x400,
                                           (anon_class_8_1_41ce32a5 *)&reduction);
        }
        vVar39.field_0 = vSplitPos_1.field_0;
        uVar34 = local_1980._8_8_;
        auVar65._4_4_ = time_range0_1.upper;
        auVar65._0_4_ = time_range0_1.lower;
        auVar65._8_8_ = 0;
        local_1a28.m128[3] = (float)local_18a8.i[3];
        local_1a28.m128[2] = (float)local_18a8.i[2];
        aStack_1a18.m128[1] = (float)aStack_1898.i[1];
        aStack_1a18.m128[0] = (float)aStack_1898.i[0];
        aStack_1a18.m128[3] = (float)aStack_1898.i[3];
        aStack_1a18.m128[2] = (float)aStack_1898.i[2];
        local_1a08.upper = local_1888.m128[1];
        local_1a08.lower = local_1888.m128[0];
        acStack_1a00._4_4_ = local_1888.m128[3];
        acStack_1a00._0_4_ = local_1888.m128[2];
        acStack_1a00._12_4_ = aStack_1878.m128[1];
        acStack_1a00._8_4_ = aStack_1878.m128[0];
        acStack_1a00._20_4_ = aStack_1878.m128[3];
        acStack_1a00._16_4_ = aStack_1878.m128[2];
        isLeft.vSplitMask._0_4_ = (undefined4)vSplitMask.field_0._0_8_;
        isLeft.vSplitMask._4_4_ = (undefined4)((ulong)vSplitMask.field_0._0_8_ >> 0x20);
        uStack_1a40 = (undefined4)vSplitMask.field_0._8_8_;
        uStack_1a3c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
        uStack_1a30 = aStack_18b8._8_8_;
        auStack_1a38 = (undefined1  [8])aStack_18b8._0_8_;
        local_1a28._0_8_ = local_18a8._0_8_;
        local_19e8 = local_1868;
        BStack_19e0 = BStack_1860;
        auVar78._4_4_ = fStack_1844;
        auVar78._0_4_ = local_1848;
        auVar78._8_8_ = 0;
        auVar83._4_4_ = fStack_183c;
        auVar83._0_4_ = fStack_1840;
        auVar83._8_8_ = 0;
        auVar61 = vcmpps_avx(auVar83,auVar65,1);
        auVar68 = vinsertps_avx(auVar65,auVar83,0x50);
        auVar69 = vinsertps_avx(auVar83,auVar65,0x50);
        auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
        auStack_19c8 = vmovlhps_avx(auVar78,auVar61);
        local_1980.m128[2] = (float)(int)uVar55;
        local_1980.m128[3] = (float)SUB84(uVar55,4);
        _reduction2_1 = local_1980.m128[2];
        fStack_16ac = local_1980.m128[3];
        BVar7 = aBStack_1358[uVar43 * 0x16];
        BVar10 = aBStack_1358[uVar43 * 0x16 + 1];
        _reduction2 = INFINITY;
        uStack_1744 = INFINITY;
        auVar66._8_4_ = 0x3f800000;
        auVar66._0_8_ = &DAT_3f8000003f800000;
        auVar66._12_4_ = 0x3f800000;
        vmovlps_avx(auVar66);
        local_1980._8_8_ = uVar34;
        if ((ulong)((long)BVar10 - (long)BVar7) < 0xc00) {
          vSplitPos_1.field_0._8_4_ = BVar10.lower;
          vSplitPos_1.field_0._12_4_ = BVar10.upper;
          vSplitPos_1.field_0._0_4_ = BVar7.lower;
          vSplitPos_1.field_0._4_4_ = BVar7.upper;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&reduction,(anon_class_24_3_35f68c7c *)&reduction2_1,
                     (range<unsigned_long> *)&vSplitPos_1);
        }
        else {
          vSplitPos_1.field_0.v[1]._4_1_ = 1;
          vSplitPos_1.field_0.v[1]._6_2_ = vVar39.field_0._14_2_;
          vSplitPos_1.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos_1);
          local_1980._0_8_ = 0x80;
          local_1698._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1698._8_8_ = &reduction2_1;
          lprims = (PrimRefVector)BVar10;
          local_1988 = BVar7;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&lprims,
                     (blocked_range<unsigned_long> *)&reduction2,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1698,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos_1,(task_group_context *)in);
          cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1)
          ;
          if (cVar40 != '\0') {
            prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar49,"task cancelled");
            __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos_1);
          uVar55 = local_1980._8_8_;
        }
        BVar7 = aBStack_1358[uVar43 * 0x16];
        BStack_1900 = BVar7;
        if (aBStack_1358[uVar43 * 0x16 + 1] != BVar7) {
          _reduction2 = &time_range1_1;
          BStack_1900 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                          (*(PrimRefMB **)(uVar55 + 0x20),(unsigned_long)BVar7,
                                           (unsigned_long)aBStack_1358[uVar43 * 0x16 + 1],0x400,
                                           (anon_class_8_1_41ce32a6 *)&reduction2);
        }
        auVar67._4_4_ = time_range1_1.upper;
        auVar67._0_4_ = time_range1_1.lower;
        auVar67._8_8_ = 0;
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        piStack_1818 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        sStack_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        local_17e8[0] = '\0';
        local_17e8[1] = '\0';
        local_17e8[2] = -0x80;
        local_17e8[3] = '\x7f';
        local_17e8[4] = '\0';
        local_17e8[5] = '\0';
        local_17e8[6] = -0x80;
        local_17e8[7] = '\x7f';
        acStack_17e0[0] = '\0';
        acStack_17e0[1] = '\0';
        acStack_17e0[2] = -0x80;
        acStack_17e0[3] = '\x7f';
        acStack_17e0[4] = '\0';
        acStack_17e0[5] = '\0';
        acStack_17e0[6] = -0x80;
        acStack_17e0[7] = '\x7f';
        acStack_17d8[0] = '\0';
        acStack_17d8[1] = '\0';
        acStack_17d8[2] = -0x80;
        acStack_17d8[3] = -1;
        acStack_17d8[4] = '\0';
        acStack_17d8[5] = '\0';
        acStack_17d8[6] = -0x80;
        acStack_17d8[7] = -1;
        acStack_17d0[0] = '\0';
        acStack_17d0[1] = '\0';
        acStack_17d0[2] = -0x80;
        acStack_17d0[3] = -1;
        acStack_17d0[4] = '\0';
        acStack_17d0[5] = '\0';
        acStack_17d0[6] = -0x80;
        acStack_17d0[7] = -1;
        BStack_17c0 = BStack_1900;
        auVar69 = ZEXT416((uint)fStack_18e0);
        auVar61 = vcmpps_avx(auVar69,auVar67,1);
        auVar68 = vinsertps_avx(auVar67,auVar69,0x50);
        auVar69 = vinsertps_avx(auVar69,auVar67,0x50);
        auVar61 = vblendvps_avx(auVar69,auVar68,auVar61);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = lVar44 << 0x20;
        _auStack_17a8 = vmovlhps_avx(auVar79,auVar61);
        local_17c8 = BVar7;
        local_1798 = (BBox1f)uVar55;
      }
      lVar44 = local_640;
      auVar61 = auStack_19c8;
      uVar33._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           new_vector_1._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar53 = local_8c8[uVar43];
      if (local_19b8 == *pBVar53) {
        pBVar53[1] = (BBox1f)((long)pBVar53[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar44 * 2] = local_19b8;
        (&local_838)[lVar44 * 2] = 1;
        local_8c8[uVar43] = &local_840 + lVar44 * 2;
      }
      lVar44 = local_640;
      if (local_1798 == *pBVar53) {
        local_8c8[local_848] = pBVar53;
        pBVar53[1] = (BBox1f)((long)pBVar53[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar44 * 2] = local_1798;
        (&local_838)[lVar44 * 2] = 1;
        local_8c8[local_848] = &local_840 + lVar44 * 2;
      }
      pBVar13 = pBVar53 + 1;
      *pBVar13 = (BBox1f)((long)*pBVar13 + -1);
      if ((*pBVar13 == (BBox1f)0x0) && (BVar7 = *pBVar53, BVar7 != (BBox1f)0x0)) {
        lVar44 = *(long *)((long)BVar7 + 0x18);
        pvVar45 = *(void **)((long)BVar7 + 0x20);
        if (pvVar45 != (void *)0x0) {
          if ((ulong)(lVar44 * 0x50) < 0x1c00000) {
            alignedFree(pvVar45);
          }
          else {
            os_free(pvVar45,lVar44 * 0x50,*(bool *)((long)BVar7 + 8));
          }
        }
        if (lVar44 != 0) {
          (**(code **)**(undefined8 **)BVar7)(*(undefined8 **)BVar7,lVar44 * -0x50,1);
        }
        *(undefined8 *)((long)BVar7 + 0x10) = 0;
        *(undefined8 *)((long)BVar7 + 0x18) = 0;
        *(undefined8 *)((long)BVar7 + 0x20) = 0;
        operator_delete((void *)BVar7);
      }
      *(Split **)(auStack_13b8 + lVar50 + -0x10) = isLeft.split;
      *(vbool **)(auStack_13b8 + lVar50) = isLeft.vSplitMask;
      *(ulong *)(auStack_13b8 + lVar50 + 8) = CONCAT44(uStack_1a3c,uStack_1a40);
      *(undefined1 (*) [8])(local_13a8 + lVar50) = auStack_1a38;
      *(undefined8 *)(local_13a8 + lVar50 + 8) = uStack_1a30;
      *(undefined8 *)(auStack_1398 + lVar50) = local_1a28._0_8_;
      ((BBox1f *)(auStack_1398 + lVar50 + 8))->lower = (float)local_1a28._8_4_;
      ((BBox1f *)(auStack_1398 + lVar50 + 8))->upper = local_1a28.m128[3];
      ((BBox1f *)(local_1388 + lVar50))->lower = (float)aStack_1a18._0_4_;
      ((BBox1f *)(local_1388 + lVar50))->upper = aStack_1a18.m128[1];
      ((BBox1f *)(local_1388 + lVar50 + 8))->lower = (float)aStack_1a18._8_4_;
      ((BBox1f *)(local_1388 + lVar50 + 8))->upper = aStack_1a18.m128[3];
      *(BBox1f *)(auStack_1378 + lVar50) = local_1a08;
      *(undefined8 *)(auStack_1378 + lVar50 + 8) = acStack_1a00._0_8_;
      *(undefined8 *)(&local_1368 + uVar43 * 0xb) = acStack_1a00._8_8_;
      *(undefined8 *)((long)&local_1368 + lVar50 + 8) = acStack_1a00._16_8_;
      aBStack_1358[uVar43 * 0x16] = local_19e8;
      aBStack_1358[uVar43 * 0x16 + 1] = BStack_19e0;
      *(ulong *)(local_1348 + uVar43 * 0x2c) = CONCAT44(uStack_19d4,uStack_19d8);
      *(ulong *)(local_1348 + uVar43 * 0x2c + 2) = CONCAT44(uStack_19cc,uStack_19d0);
      (&local_1338)[uVar43 * 0x16].lower = (float)auStack_19c8._0_4_;
      (&local_1338)[uVar43 * 0x16].upper = (float)auStack_19c8._4_4_;
      local_1328[uVar43 * 0x16 + -1].lower = (float)auStack_19c8._8_4_;
      local_1328[uVar43 * 0x16 + -1].upper = (float)auStack_19c8._12_4_;
      local_1328[uVar43 * 0x16] = local_19b8;
      uVar56 = local_848;
      lVar50 = local_848 * 0xb0;
      *(longlong *)(auStack_13b8 + lVar50 + -0x10) = vSplitPos.field_0.v[0];
      *(undefined8 *)(auStack_13b8 + lVar50) = local_1828._0_8_;
      *(undefined8 *)(auStack_13b8 + lVar50 + 8) = local_1828._8_8_;
      *(intrusive_list_node **)(local_13a8 + lVar50) = piStack_1818;
      *(intrusive_list_node **)(local_13a8 + lVar50 + 8) = piStack_1810;
      *(__base_type *)(auStack_1398 + lVar50) = local_1808._M_b._M_p;
      *(void **)(auStack_1398 + lVar50 + 8) = pvStack_1800;
      *(string_resource_index *)(local_1388 + lVar50) = sStack_17f8;
      *(char (*) [8])(local_1388 + lVar50 + 8) = acStack_17f0;
      *(char (*) [8])(auStack_1378 + lVar50) = local_17e8;
      *(char (*) [8])(auStack_1378 + lVar50 + 8) = acStack_17e0;
      *(char (*) [8])(&local_1368 + uVar56 * 0xb) = acStack_17d8;
      *(char (*) [8])((long)&local_1368 + lVar50 + 8) = acStack_17d0;
      aBStack_1358[uVar56 * 0x16] = local_17c8;
      aBStack_1358[uVar56 * 0x16 + 1] = BStack_17c0;
      *(undefined8 *)(local_1348 + uVar56 * 0x2c) = uStack_17b8;
      *(undefined8 *)(local_1348 + uVar56 * 0x2c + 2) = uStack_17b0;
      (&local_1338)[uVar56 * 0x16].lower = (float)auStack_17a8._0_4_;
      (&local_1338)[uVar56 * 0x16].upper = (float)auStack_17a8._4_4_;
      local_1328[uVar56 * 0x16 + -1].lower = (float)uStack_17a0;
      local_1328[uVar56 * 0x16 + -1].upper = uStack_17a0._4_4_;
      local_1328[uVar56 * 0x16] = local_1798;
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector_1._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector_1,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector_1._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar59 = bVar59 | (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         )uVar33._M_t.
                          super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                          .
                          super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         )0x0;
      auStack_19c8 = auVar61;
    }
  } while (uVar43 != 0xffffffffffffffff);
  aVar24 = _auStack_1a38;
  if (local_848 != 0) {
    puVar51 = &uStack_132c;
    uVar43 = local_848;
    do {
      auVar61 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar51[-1]),1);
      auVar68 = vcmpps_avx(ZEXT416(*puVar51),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar61 = vorps_avx(auVar61,auVar68);
      bVar59 = bVar59 | auVar61[0];
      puVar51 = puVar51 + 0x2c;
      uVar43 = uVar43 - 1;
    } while (uVar43 != 0);
  }
  if ((bVar59 & 1) == 0) {
    _reduction = (code *)0x1c0;
    pTVar11 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar11;
      MutexSys::lock(&pTVar11->mutex);
      if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
             ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar11->alloc0).end = auVar72._0_8_;
      (pTVar11->alloc0).allocBlockSize = auVar72._8_8_;
      (pTVar11->alloc0).bytesUsed = auVar72._16_8_;
      (pTVar11->alloc0).bytesWasted = auVar72._24_8_;
      (pTVar11->alloc0).ptr = (char *)auVar72._0_8_;
      (pTVar11->alloc0).cur = auVar72._8_8_;
      (pTVar11->alloc0).end = auVar72._16_8_;
      (pTVar11->alloc0).allocBlockSize = auVar72._24_8_;
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar11->alloc1).end = auVar72._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar11->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar11->alloc1).cur = auVar72._8_8_;
        (pTVar11->alloc1).end = auVar72._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar72._24_8_;
      }
      else {
        (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar11->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar11->alloc1).cur = auVar72._8_8_;
        (pTVar11->alloc1).end = auVar72._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar72._24_8_;
        (pTVar11->alloc1).end = auVar72._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar11->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar11;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar12._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar12,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar12._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      if ((char)isLeft.vSplitPos == '\x01') {
        MutexSys::unlock((MutexSys *)isLeft.split);
      }
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar48 = (alloc.talloc0)->cur;
    uVar43 = (ulong)(-(int)sVar48 & 0x1f);
    uVar56 = sVar48 + (long)_reduction + uVar43;
    (alloc.talloc0)->cur = uVar56;
    if ((alloc.talloc0)->end < uVar56) {
      (alloc.talloc0)->cur = sVar48;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar57;
        sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar48;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar57;
          sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar48;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar57 = (char *)0x0;
            goto LAB_013f9fcd;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar48;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
      pcVar57 = (alloc.talloc0)->ptr + (uVar56 - (long)_reduction);
    }
LAB_013f9fcd:
    pcVar57[0xc0] = '\0';
    pcVar57[0xc1] = '\0';
    pcVar57[0xc2] = -0x80;
    pcVar57[0xc3] = '\x7f';
    pcVar57[0xc4] = '\0';
    pcVar57[0xc5] = '\0';
    pcVar57[0xc6] = -0x80;
    pcVar57[199] = '\x7f';
    pcVar57[200] = '\0';
    pcVar57[0xc9] = '\0';
    pcVar57[0xca] = -0x80;
    pcVar57[0xcb] = '\x7f';
    pcVar57[0xcc] = '\0';
    pcVar57[0xcd] = '\0';
    pcVar57[0xce] = -0x80;
    pcVar57[0xcf] = '\x7f';
    pcVar57[0xd0] = '\0';
    pcVar57[0xd1] = '\0';
    pcVar57[0xd2] = -0x80;
    pcVar57[0xd3] = '\x7f';
    pcVar57[0xd4] = '\0';
    pcVar57[0xd5] = '\0';
    pcVar57[0xd6] = -0x80;
    pcVar57[0xd7] = '\x7f';
    pcVar57[0xd8] = '\0';
    pcVar57[0xd9] = '\0';
    pcVar57[0xda] = -0x80;
    pcVar57[0xdb] = '\x7f';
    pcVar57[0xdc] = '\0';
    pcVar57[0xdd] = '\0';
    pcVar57[0xde] = -0x80;
    pcVar57[0xdf] = '\x7f';
    pcVar57[0x80] = '\0';
    pcVar57[0x81] = '\0';
    pcVar57[0x82] = -0x80;
    pcVar57[0x83] = '\x7f';
    pcVar57[0x84] = '\0';
    pcVar57[0x85] = '\0';
    pcVar57[0x86] = -0x80;
    pcVar57[0x87] = '\x7f';
    pcVar57[0x88] = '\0';
    pcVar57[0x89] = '\0';
    pcVar57[0x8a] = -0x80;
    pcVar57[0x8b] = '\x7f';
    pcVar57[0x8c] = '\0';
    pcVar57[0x8d] = '\0';
    pcVar57[0x8e] = -0x80;
    pcVar57[0x8f] = '\x7f';
    pcVar57[0x90] = '\0';
    pcVar57[0x91] = '\0';
    pcVar57[0x92] = -0x80;
    pcVar57[0x93] = '\x7f';
    pcVar57[0x94] = '\0';
    pcVar57[0x95] = '\0';
    pcVar57[0x96] = -0x80;
    pcVar57[0x97] = '\x7f';
    pcVar57[0x98] = '\0';
    pcVar57[0x99] = '\0';
    pcVar57[0x9a] = -0x80;
    pcVar57[0x9b] = '\x7f';
    pcVar57[0x9c] = '\0';
    pcVar57[0x9d] = '\0';
    pcVar57[0x9e] = -0x80;
    pcVar57[0x9f] = '\x7f';
    pcVar57[0x40] = '\0';
    pcVar57[0x41] = '\0';
    pcVar57[0x42] = -0x80;
    pcVar57[0x43] = '\x7f';
    pcVar57[0x44] = '\0';
    pcVar57[0x45] = '\0';
    pcVar57[0x46] = -0x80;
    pcVar57[0x47] = '\x7f';
    pcVar57[0x48] = '\0';
    pcVar57[0x49] = '\0';
    pcVar57[0x4a] = -0x80;
    pcVar57[0x4b] = '\x7f';
    pcVar57[0x4c] = '\0';
    pcVar57[0x4d] = '\0';
    pcVar57[0x4e] = -0x80;
    pcVar57[0x4f] = '\x7f';
    pcVar57[0x50] = '\0';
    pcVar57[0x51] = '\0';
    pcVar57[0x52] = -0x80;
    pcVar57[0x53] = '\x7f';
    pcVar57[0x54] = '\0';
    pcVar57[0x55] = '\0';
    pcVar57[0x56] = -0x80;
    pcVar57[0x57] = '\x7f';
    pcVar57[0x58] = '\0';
    pcVar57[0x59] = '\0';
    pcVar57[0x5a] = -0x80;
    pcVar57[0x5b] = '\x7f';
    pcVar57[0x5c] = '\0';
    pcVar57[0x5d] = '\0';
    pcVar57[0x5e] = -0x80;
    pcVar57[0x5f] = '\x7f';
    pcVar57[0xe0] = '\0';
    pcVar57[0xe1] = '\0';
    pcVar57[0xe2] = -0x80;
    pcVar57[0xe3] = -1;
    pcVar57[0xe4] = '\0';
    pcVar57[0xe5] = '\0';
    pcVar57[0xe6] = -0x80;
    pcVar57[0xe7] = -1;
    pcVar57[0xe8] = '\0';
    pcVar57[0xe9] = '\0';
    pcVar57[0xea] = -0x80;
    pcVar57[0xeb] = -1;
    pcVar57[0xec] = '\0';
    pcVar57[0xed] = '\0';
    pcVar57[0xee] = -0x80;
    pcVar57[0xef] = -1;
    pcVar57[0xf0] = '\0';
    pcVar57[0xf1] = '\0';
    pcVar57[0xf2] = -0x80;
    pcVar57[0xf3] = -1;
    pcVar57[0xf4] = '\0';
    pcVar57[0xf5] = '\0';
    pcVar57[0xf6] = -0x80;
    pcVar57[0xf7] = -1;
    pcVar57[0xf8] = '\0';
    pcVar57[0xf9] = '\0';
    pcVar57[0xfa] = -0x80;
    pcVar57[0xfb] = -1;
    pcVar57[0xfc] = '\0';
    pcVar57[0xfd] = '\0';
    pcVar57[0xfe] = -0x80;
    pcVar57[0xff] = -1;
    pcVar57[0xa0] = '\0';
    pcVar57[0xa1] = '\0';
    pcVar57[0xa2] = -0x80;
    pcVar57[0xa3] = -1;
    pcVar57[0xa4] = '\0';
    pcVar57[0xa5] = '\0';
    pcVar57[0xa6] = -0x80;
    pcVar57[0xa7] = -1;
    pcVar57[0xa8] = '\0';
    pcVar57[0xa9] = '\0';
    pcVar57[0xaa] = -0x80;
    pcVar57[0xab] = -1;
    pcVar57[0xac] = '\0';
    pcVar57[0xad] = '\0';
    pcVar57[0xae] = -0x80;
    pcVar57[0xaf] = -1;
    pcVar57[0xb0] = '\0';
    pcVar57[0xb1] = '\0';
    pcVar57[0xb2] = -0x80;
    pcVar57[0xb3] = -1;
    pcVar57[0xb4] = '\0';
    pcVar57[0xb5] = '\0';
    pcVar57[0xb6] = -0x80;
    pcVar57[0xb7] = -1;
    pcVar57[0xb8] = '\0';
    pcVar57[0xb9] = '\0';
    pcVar57[0xba] = -0x80;
    pcVar57[0xbb] = -1;
    pcVar57[0xbc] = '\0';
    pcVar57[0xbd] = '\0';
    pcVar57[0xbe] = -0x80;
    pcVar57[0xbf] = -1;
    pcVar57[0x60] = '\0';
    pcVar57[0x61] = '\0';
    pcVar57[0x62] = -0x80;
    pcVar57[99] = -1;
    pcVar57[100] = '\0';
    pcVar57[0x65] = '\0';
    pcVar57[0x66] = -0x80;
    pcVar57[0x67] = -1;
    pcVar57[0x68] = '\0';
    pcVar57[0x69] = '\0';
    pcVar57[0x6a] = -0x80;
    pcVar57[0x6b] = -1;
    pcVar57[0x6c] = '\0';
    pcVar57[0x6d] = '\0';
    pcVar57[0x6e] = -0x80;
    pcVar57[0x6f] = -1;
    pcVar57[0x70] = '\0';
    pcVar57[0x71] = '\0';
    pcVar57[0x72] = -0x80;
    pcVar57[0x73] = -1;
    pcVar57[0x74] = '\0';
    pcVar57[0x75] = '\0';
    pcVar57[0x76] = -0x80;
    pcVar57[0x77] = -1;
    pcVar57[0x78] = '\0';
    pcVar57[0x79] = '\0';
    pcVar57[0x7a] = -0x80;
    pcVar57[0x7b] = -1;
    pcVar57[0x7c] = '\0';
    pcVar57[0x7d] = '\0';
    pcVar57[0x7e] = -0x80;
    pcVar57[0x7f] = -1;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar57 + 0x100) = auVar72;
    *(undefined1 (*) [32])(pcVar57 + 0x120) = auVar72;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar57 + 0x140) = auVar72;
    *(undefined1 (*) [32])(pcVar57 + 0x160) = auVar72;
    *(undefined1 (*) [32])(pcVar57 + 0x180) = auVar72;
    *(undefined1 (*) [32])(pcVar57 + 0x1a0) = auVar72;
    lVar50 = 0;
    do {
      pcVar4 = pcVar57 + lVar50 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\b';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      pcVar4[0x10] = '\b';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\b';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      lVar50 = lVar50 + 4;
    } while (lVar50 != 8);
    uVar43 = 1;
    goto LAB_013fa06f;
  }
  _reduction = (code *)0x200;
  pTVar11 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar11;
    MutexSys::lock(&pTVar11->mutex);
    if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
           ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar11->alloc0).end = auVar72._0_8_;
    (pTVar11->alloc0).allocBlockSize = auVar72._8_8_;
    (pTVar11->alloc0).bytesUsed = auVar72._16_8_;
    (pTVar11->alloc0).bytesWasted = auVar72._24_8_;
    (pTVar11->alloc0).ptr = (char *)auVar72._0_8_;
    (pTVar11->alloc0).cur = auVar72._8_8_;
    (pTVar11->alloc0).end = auVar72._16_8_;
    (pTVar11->alloc0).allocBlockSize = auVar72._24_8_;
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar11->alloc1).end = auVar72._0_8_;
      (pTVar11->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar11->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar11->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar11->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar11->alloc1).cur = auVar72._8_8_;
      (pTVar11->alloc1).end = auVar72._16_8_;
      (pTVar11->alloc1).allocBlockSize = auVar72._24_8_;
    }
    else {
      (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar11->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar11->alloc1).cur = auVar72._8_8_;
      (pTVar11->alloc1).end = auVar72._16_8_;
      (pTVar11->alloc1).allocBlockSize = auVar72._24_8_;
      (pTVar11->alloc1).end = auVar72._0_8_;
      (pTVar11->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar11->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar11->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar11->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar11;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar12._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar12._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar12,(ThreadLocal2 **)&vSplitMask);
    }
    else {
      *iVar12._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)isLeft.vSplitPos == '\x01') {
      MutexSys::unlock((MutexSys *)isLeft.split);
    }
    if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
  sVar48 = (alloc.talloc0)->cur;
  uVar43 = (ulong)(-(int)sVar48 & 0x1f);
  uVar56 = sVar48 + (long)_reduction + uVar43;
  (alloc.talloc0)->cur = uVar56;
  if ((alloc.talloc0)->end < uVar56) {
    (alloc.talloc0)->cur = sVar48;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar57;
      sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar48;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar57 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar57;
        sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar48;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar57 = (char *)0x0;
          goto LAB_013f9e9b;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar48;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
    pcVar57 = (alloc.talloc0)->ptr + (uVar56 - (long)_reduction);
  }
LAB_013f9e9b:
  pcVar57[0x1c0] = '\0';
  pcVar57[0x1c1] = '\0';
  pcVar57[0x1c2] = -0x80;
  pcVar57[0x1c3] = '\x7f';
  pcVar57[0x1c4] = '\0';
  pcVar57[0x1c5] = '\0';
  pcVar57[0x1c6] = -0x80;
  pcVar57[0x1c7] = '\x7f';
  pcVar57[0x1c8] = '\0';
  pcVar57[0x1c9] = '\0';
  pcVar57[0x1ca] = -0x80;
  pcVar57[0x1cb] = '\x7f';
  pcVar57[0x1cc] = '\0';
  pcVar57[0x1cd] = '\0';
  pcVar57[0x1ce] = -0x80;
  pcVar57[0x1cf] = '\x7f';
  pcVar57[0x1d0] = '\0';
  pcVar57[0x1d1] = '\0';
  pcVar57[0x1d2] = -0x80;
  pcVar57[0x1d3] = '\x7f';
  pcVar57[0x1d4] = '\0';
  pcVar57[0x1d5] = '\0';
  pcVar57[0x1d6] = -0x80;
  pcVar57[0x1d7] = '\x7f';
  pcVar57[0x1d8] = '\0';
  pcVar57[0x1d9] = '\0';
  pcVar57[0x1da] = -0x80;
  pcVar57[0x1db] = '\x7f';
  pcVar57[0x1dc] = '\0';
  pcVar57[0x1dd] = '\0';
  pcVar57[0x1de] = -0x80;
  pcVar57[0x1df] = '\x7f';
  pcVar57[0x1e0] = '\0';
  pcVar57[0x1e1] = '\0';
  pcVar57[0x1e2] = -0x80;
  pcVar57[0x1e3] = -1;
  pcVar57[0x1e4] = '\0';
  pcVar57[0x1e5] = '\0';
  pcVar57[0x1e6] = -0x80;
  pcVar57[0x1e7] = -1;
  pcVar57[0x1e8] = '\0';
  pcVar57[0x1e9] = '\0';
  pcVar57[0x1ea] = -0x80;
  pcVar57[0x1eb] = -1;
  pcVar57[0x1ec] = '\0';
  pcVar57[0x1ed] = '\0';
  pcVar57[0x1ee] = -0x80;
  pcVar57[0x1ef] = -1;
  pcVar57[0x1f0] = '\0';
  pcVar57[0x1f1] = '\0';
  pcVar57[0x1f2] = -0x80;
  pcVar57[499] = -1;
  pcVar57[500] = '\0';
  pcVar57[0x1f5] = '\0';
  pcVar57[0x1f6] = -0x80;
  pcVar57[0x1f7] = -1;
  pcVar57[0x1f8] = '\0';
  pcVar57[0x1f9] = '\0';
  pcVar57[0x1fa] = -0x80;
  pcVar57[0x1fb] = -1;
  pcVar57[0x1fc] = '\0';
  pcVar57[0x1fd] = '\0';
  pcVar57[0x1fe] = -0x80;
  pcVar57[0x1ff] = -1;
  pcVar57[0xc0] = '\0';
  pcVar57[0xc1] = '\0';
  pcVar57[0xc2] = -0x80;
  pcVar57[0xc3] = '\x7f';
  pcVar57[0xc4] = '\0';
  pcVar57[0xc5] = '\0';
  pcVar57[0xc6] = -0x80;
  pcVar57[199] = '\x7f';
  pcVar57[200] = '\0';
  pcVar57[0xc9] = '\0';
  pcVar57[0xca] = -0x80;
  pcVar57[0xcb] = '\x7f';
  pcVar57[0xcc] = '\0';
  pcVar57[0xcd] = '\0';
  pcVar57[0xce] = -0x80;
  pcVar57[0xcf] = '\x7f';
  pcVar57[0xd0] = '\0';
  pcVar57[0xd1] = '\0';
  pcVar57[0xd2] = -0x80;
  pcVar57[0xd3] = '\x7f';
  pcVar57[0xd4] = '\0';
  pcVar57[0xd5] = '\0';
  pcVar57[0xd6] = -0x80;
  pcVar57[0xd7] = '\x7f';
  pcVar57[0xd8] = '\0';
  pcVar57[0xd9] = '\0';
  pcVar57[0xda] = -0x80;
  pcVar57[0xdb] = '\x7f';
  pcVar57[0xdc] = '\0';
  pcVar57[0xdd] = '\0';
  pcVar57[0xde] = -0x80;
  pcVar57[0xdf] = '\x7f';
  pcVar57[0x80] = '\0';
  pcVar57[0x81] = '\0';
  pcVar57[0x82] = -0x80;
  pcVar57[0x83] = '\x7f';
  pcVar57[0x84] = '\0';
  pcVar57[0x85] = '\0';
  pcVar57[0x86] = -0x80;
  pcVar57[0x87] = '\x7f';
  pcVar57[0x88] = '\0';
  pcVar57[0x89] = '\0';
  pcVar57[0x8a] = -0x80;
  pcVar57[0x8b] = '\x7f';
  pcVar57[0x8c] = '\0';
  pcVar57[0x8d] = '\0';
  pcVar57[0x8e] = -0x80;
  pcVar57[0x8f] = '\x7f';
  pcVar57[0x90] = '\0';
  pcVar57[0x91] = '\0';
  pcVar57[0x92] = -0x80;
  pcVar57[0x93] = '\x7f';
  pcVar57[0x94] = '\0';
  pcVar57[0x95] = '\0';
  pcVar57[0x96] = -0x80;
  pcVar57[0x97] = '\x7f';
  pcVar57[0x98] = '\0';
  pcVar57[0x99] = '\0';
  pcVar57[0x9a] = -0x80;
  pcVar57[0x9b] = '\x7f';
  pcVar57[0x9c] = '\0';
  pcVar57[0x9d] = '\0';
  pcVar57[0x9e] = -0x80;
  pcVar57[0x9f] = '\x7f';
  pcVar57[0x40] = '\0';
  pcVar57[0x41] = '\0';
  pcVar57[0x42] = -0x80;
  pcVar57[0x43] = '\x7f';
  pcVar57[0x44] = '\0';
  pcVar57[0x45] = '\0';
  pcVar57[0x46] = -0x80;
  pcVar57[0x47] = '\x7f';
  pcVar57[0x48] = '\0';
  pcVar57[0x49] = '\0';
  pcVar57[0x4a] = -0x80;
  pcVar57[0x4b] = '\x7f';
  pcVar57[0x4c] = '\0';
  pcVar57[0x4d] = '\0';
  pcVar57[0x4e] = -0x80;
  pcVar57[0x4f] = '\x7f';
  pcVar57[0x50] = '\0';
  pcVar57[0x51] = '\0';
  pcVar57[0x52] = -0x80;
  pcVar57[0x53] = '\x7f';
  pcVar57[0x54] = '\0';
  pcVar57[0x55] = '\0';
  pcVar57[0x56] = -0x80;
  pcVar57[0x57] = '\x7f';
  pcVar57[0x58] = '\0';
  pcVar57[0x59] = '\0';
  pcVar57[0x5a] = -0x80;
  pcVar57[0x5b] = '\x7f';
  pcVar57[0x5c] = '\0';
  pcVar57[0x5d] = '\0';
  pcVar57[0x5e] = -0x80;
  pcVar57[0x5f] = '\x7f';
  pcVar57[0xe0] = '\0';
  pcVar57[0xe1] = '\0';
  pcVar57[0xe2] = -0x80;
  pcVar57[0xe3] = -1;
  pcVar57[0xe4] = '\0';
  pcVar57[0xe5] = '\0';
  pcVar57[0xe6] = -0x80;
  pcVar57[0xe7] = -1;
  pcVar57[0xe8] = '\0';
  pcVar57[0xe9] = '\0';
  pcVar57[0xea] = -0x80;
  pcVar57[0xeb] = -1;
  pcVar57[0xec] = '\0';
  pcVar57[0xed] = '\0';
  pcVar57[0xee] = -0x80;
  pcVar57[0xef] = -1;
  pcVar57[0xf0] = '\0';
  pcVar57[0xf1] = '\0';
  pcVar57[0xf2] = -0x80;
  pcVar57[0xf3] = -1;
  pcVar57[0xf4] = '\0';
  pcVar57[0xf5] = '\0';
  pcVar57[0xf6] = -0x80;
  pcVar57[0xf7] = -1;
  pcVar57[0xf8] = '\0';
  pcVar57[0xf9] = '\0';
  pcVar57[0xfa] = -0x80;
  pcVar57[0xfb] = -1;
  pcVar57[0xfc] = '\0';
  pcVar57[0xfd] = '\0';
  pcVar57[0xfe] = -0x80;
  pcVar57[0xff] = -1;
  pcVar57[0xa0] = '\0';
  pcVar57[0xa1] = '\0';
  pcVar57[0xa2] = -0x80;
  pcVar57[0xa3] = -1;
  pcVar57[0xa4] = '\0';
  pcVar57[0xa5] = '\0';
  pcVar57[0xa6] = -0x80;
  pcVar57[0xa7] = -1;
  pcVar57[0xa8] = '\0';
  pcVar57[0xa9] = '\0';
  pcVar57[0xaa] = -0x80;
  pcVar57[0xab] = -1;
  pcVar57[0xac] = '\0';
  pcVar57[0xad] = '\0';
  pcVar57[0xae] = -0x80;
  pcVar57[0xaf] = -1;
  pcVar57[0xb0] = '\0';
  pcVar57[0xb1] = '\0';
  pcVar57[0xb2] = -0x80;
  pcVar57[0xb3] = -1;
  pcVar57[0xb4] = '\0';
  pcVar57[0xb5] = '\0';
  pcVar57[0xb6] = -0x80;
  pcVar57[0xb7] = -1;
  pcVar57[0xb8] = '\0';
  pcVar57[0xb9] = '\0';
  pcVar57[0xba] = -0x80;
  pcVar57[0xbb] = -1;
  pcVar57[0xbc] = '\0';
  pcVar57[0xbd] = '\0';
  pcVar57[0xbe] = -0x80;
  pcVar57[0xbf] = -1;
  pcVar57[0x60] = '\0';
  pcVar57[0x61] = '\0';
  pcVar57[0x62] = -0x80;
  pcVar57[99] = -1;
  pcVar57[100] = '\0';
  pcVar57[0x65] = '\0';
  pcVar57[0x66] = -0x80;
  pcVar57[0x67] = -1;
  pcVar57[0x68] = '\0';
  pcVar57[0x69] = '\0';
  pcVar57[0x6a] = -0x80;
  pcVar57[0x6b] = -1;
  pcVar57[0x6c] = '\0';
  pcVar57[0x6d] = '\0';
  pcVar57[0x6e] = -0x80;
  pcVar57[0x6f] = -1;
  pcVar57[0x70] = '\0';
  pcVar57[0x71] = '\0';
  pcVar57[0x72] = -0x80;
  pcVar57[0x73] = -1;
  pcVar57[0x74] = '\0';
  pcVar57[0x75] = '\0';
  pcVar57[0x76] = -0x80;
  pcVar57[0x77] = -1;
  pcVar57[0x78] = '\0';
  pcVar57[0x79] = '\0';
  pcVar57[0x7a] = -0x80;
  pcVar57[0x7b] = -1;
  pcVar57[0x7c] = '\0';
  pcVar57[0x7d] = '\0';
  pcVar57[0x7e] = -0x80;
  pcVar57[0x7f] = -1;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar57 + 0x100) = auVar72;
  *(undefined1 (*) [32])(pcVar57 + 0x120) = auVar72;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar57 + 0x140) = auVar72;
  *(undefined1 (*) [32])(pcVar57 + 0x160) = auVar72;
  *(undefined1 (*) [32])(pcVar57 + 0x180) = auVar72;
  *(undefined1 (*) [32])(pcVar57 + 0x1a0) = auVar72;
  lVar50 = 0;
  do {
    pcVar4 = pcVar57 + lVar50 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\b';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    pcVar4[0x10] = '\b';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    pcVar4[0x17] = '\0';
    pcVar4[0x18] = '\b';
    pcVar4[0x19] = '\0';
    pcVar4[0x1a] = '\0';
    pcVar4[0x1b] = '\0';
    pcVar4[0x1c] = '\0';
    pcVar4[0x1d] = '\0';
    pcVar4[0x1e] = '\0';
    pcVar4[0x1f] = '\0';
    lVar50 = lVar50 + 4;
  } while (lVar50 != 8);
  uVar43 = 6;
LAB_013fa06f:
  uVar56 = local_848;
  if ((this->cfg).singleThreadThreshold <
      (in->prims).super_PrimInfoMB.object_range._end -
      (in->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    aStack_18b8._0_8_ = &lock;
    isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::r1::initialize((task_group_context *)&isLeft);
    vSplitPos.field_0.v[1] = 0;
    vSplitPos.field_0.v[0] = uVar56;
    local_1828._0_8_ = (BBox1f *)0x1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
          (auto_partitioner *)&reduction2,(task_group_context *)&isLeft);
    cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar40 != '\0') {
      prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar49,"task cancelled");
      __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&isLeft);
    local_1ac8._8_4_ = 0xff800000;
    local_1ac8._0_8_ = 0xff800000ff800000;
    local_1ac8._12_4_ = 0xff800000;
    local_1ab8._8_4_ = 0x7f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    local_1ab8._12_4_ = 0x7f800000;
    if (local_848 != 0) {
      paVar52 = &values[0].lbounds.bounds1.upper.field_0;
      local_1ab8._8_4_ = 0x7f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1ab8._12_4_ = 0x7f800000;
      local_1a88._8_4_ = 0x7f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1a88._12_4_ = 0x7f800000;
      local_1ac8._8_4_ = 0xff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1ac8._12_4_ = 0xff800000;
      local_1a98._8_4_ = 0xff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      local_1a98._12_4_ = 0xff800000;
      uVar56 = local_848;
      do {
        local_1ab8 = vminps_avx(local_1ab8,(undefined1  [16])paVar52[-3]);
        local_1ac8 = vmaxps_avx(local_1ac8,(undefined1  [16])paVar52[-2]);
        local_1a88 = vminps_avx(local_1a88,*(undefined1 (*) [16])&paVar52[-1].field_1.x);
        local_1a98 = vmaxps_avx(local_1a98,(undefined1  [16])*paVar52);
        paVar52 = paVar52 + 6;
        uVar56 = uVar56 - 1;
      } while (uVar56 != 0);
    }
  }
  else {
    local_1ac8._8_4_ = 0xff800000;
    local_1ac8._0_8_ = 0xff800000ff800000;
    local_1ac8._12_4_ = 0xff800000;
    local_1ab8._8_4_ = 0x7f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    local_1ab8._12_4_ = 0x7f800000;
    if (-1 < (long)(local_848 - 1)) {
      pBVar53 = &BStack_648 + local_848 * 0xc;
      pBVar101 = (BuildRecord *)(auStack_13b8 + local_848 * 0xb0 + -0x10);
      local_1ab8._8_4_ = 0x7f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1ab8._12_4_ = 0x7f800000;
      local_1a88._8_4_ = 0x7f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1a88._12_4_ = 0x7f800000;
      local_1ac8._8_4_ = 0xff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1ac8._12_4_ = 0xff800000;
      local_1a98._8_4_ = 0xff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      local_1a98._12_4_ = 0xff800000;
      do {
        pBVar101 = pBVar101 + -1;
        alloc_01.talloc0 = alloc.talloc0;
        alloc_01.alloc = alloc.alloc;
        alloc_01.talloc1 = alloc.talloc1;
        recurse((NodeRecordMB4D *)&isLeft,this,pBVar101,alloc_01,false);
        pBVar53[-10] = (BBox1f)isLeft.split;
        auVar18._8_4_ = uStack_1a40;
        auVar18._0_8_ = isLeft.vSplitMask;
        auVar18._12_4_ = uStack_1a3c;
        *(undefined1 (*) [16])(pBVar53 + -8) = auVar18;
        auStack_1a38 = aVar24._0_8_;
        pBVar53[-6].lower = (float)auStack_1a38._0_4_;
        pBVar53[-6].upper = (float)auStack_1a38._4_4_;
        pBVar53[-5].lower = (float)(undefined4)uStack_1a30;
        pBVar53[-5].upper = (float)uStack_1a30._4_4_;
        pBVar53[-4].lower = (float)local_1a28._0_4_;
        pBVar53[-4].upper = local_1a28.m128[1];
        pBVar53[-3].lower = (float)local_1a28._8_4_;
        pBVar53[-3].upper = local_1a28.m128[3];
        pBVar53[-2].lower = (float)aStack_1a18._0_4_;
        pBVar53[-2].upper = aStack_1a18.m128[1];
        pBVar53[-1].lower = (float)aStack_1a18._8_4_;
        pBVar53[-1].upper = aStack_1a18.m128[3];
        *pBVar53 = local_1a08;
        local_1ab8 = vminps_avx(local_1ab8,auVar18);
        local_1ac8 = vmaxps_avx(local_1ac8,*(undefined1 (*) [16])(pBVar53 + -6));
        local_1a88 = vminps_avx(local_1a88,*(undefined1 (*) [16])(pBVar53 + -4));
        local_1a98 = vmaxps_avx(local_1a98,*(undefined1 (*) [16])(pBVar53 + -2));
        uVar56 = uVar56 - 1;
        pBVar53 = pBVar53 + -0xc;
      } while (0 < (long)uVar56);
    }
  }
  uVar43 = uVar43 | (ulong)pcVar57;
  if (((uint)uVar43 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar58 = (ulong)pcVar57 & 0xfffffffffffffff0;
      pfVar46 = &values[0].dt.upper;
      uVar56 = 0;
      auVar84._8_4_ = 0x7f7fffff;
      auVar84._0_8_ = 0x7f7fffff7f7fffff;
      auVar84._12_4_ = 0x7f7fffff;
      auVar88._8_4_ = 0xff7fffff;
      auVar88._0_8_ = 0xff7fffffff7fffff;
      auVar88._12_4_ = 0xff7fffff;
      auVar89._8_4_ = 0x7fffffff;
      auVar89._0_8_ = 0x7fffffff7fffffff;
      auVar89._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar58 + uVar56 * 8) = *(undefined8 *)(pfVar46 + -0x15);
        fVar60 = ((BBox1f *)(pfVar46 + -1))->lower;
        fVar90 = 1.0 / (*pfVar46 - fVar60);
        fVar5 = -fVar60 * fVar90;
        auVar61 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
        auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar5)),ZEXT416((uint)(1.0 - fVar5)),0);
        auVar100._0_4_ = pfVar46[-9] * auVar61._0_4_ + pfVar46[-0x11] * auVar68._0_4_;
        auVar100._4_4_ = pfVar46[-8] * auVar61._4_4_ + pfVar46[-0x10] * auVar68._4_4_;
        auVar100._8_4_ = pfVar46[-7] * auVar61._8_4_ + pfVar46[-0xf] * auVar68._8_4_;
        auVar100._12_4_ = pfVar46[-6] * auVar61._12_4_ + pfVar46[-0xe] * auVar68._12_4_;
        auVar95._0_4_ = pfVar46[-5] * auVar61._0_4_ + pfVar46[-0xd] * auVar68._0_4_;
        auVar95._4_4_ = pfVar46[-4] * auVar61._4_4_ + pfVar46[-0xc] * auVar68._4_4_;
        auVar95._8_4_ = pfVar46[-3] * auVar61._8_4_ + pfVar46[-0xb] * auVar68._8_4_;
        auVar95._12_4_ = pfVar46[-2] * auVar61._12_4_ + pfVar46[-10] * auVar68._12_4_;
        fVar90 = (1.0 - fVar60) * fVar90;
        auVar61 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
        auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar90)),ZEXT416((uint)(1.0 - fVar90)),0);
        auVar97._0_4_ = pfVar46[-9] * auVar61._0_4_ + pfVar46[-0x11] * auVar68._0_4_;
        auVar97._4_4_ = pfVar46[-8] * auVar61._4_4_ + pfVar46[-0x10] * auVar68._4_4_;
        auVar97._8_4_ = pfVar46[-7] * auVar61._8_4_ + pfVar46[-0xf] * auVar68._8_4_;
        auVar97._12_4_ = pfVar46[-6] * auVar61._12_4_ + pfVar46[-0xe] * auVar68._12_4_;
        auVar92._0_4_ = pfVar46[-5] * auVar61._0_4_ + pfVar46[-0xd] * auVar68._0_4_;
        auVar92._4_4_ = pfVar46[-4] * auVar61._4_4_ + pfVar46[-0xc] * auVar68._4_4_;
        auVar92._8_4_ = pfVar46[-3] * auVar61._8_4_ + pfVar46[-0xb] * auVar68._8_4_;
        auVar92._12_4_ = pfVar46[-2] * auVar61._12_4_ + pfVar46[-10] * auVar68._12_4_;
        auVar70 = vminps_avx(auVar100,auVar84);
        auVar68 = vmaxps_avx(auVar95,auVar88);
        auVar80 = vminps_avx(auVar97,auVar84);
        auVar69 = vmaxps_avx(auVar92,auVar88);
        auVar61 = vandps_avx(auVar70,auVar89);
        auVar98._0_4_ = auVar61._0_4_ * 4.7683716e-07;
        auVar98._4_4_ = auVar61._4_4_ * 4.7683716e-07;
        auVar98._8_4_ = auVar61._8_4_ * 4.7683716e-07;
        auVar98._12_4_ = auVar61._12_4_ * 4.7683716e-07;
        auVar70 = vsubps_avx(auVar70,auVar98);
        auVar61 = vandps_avx(auVar68,auVar89);
        auVar96._0_4_ = auVar68._0_4_ + auVar61._0_4_ * 4.7683716e-07;
        auVar96._4_4_ = auVar68._4_4_ + auVar61._4_4_ * 4.7683716e-07;
        auVar96._8_4_ = auVar68._8_4_ + auVar61._8_4_ * 4.7683716e-07;
        auVar96._12_4_ = auVar68._12_4_ + auVar61._12_4_ * 4.7683716e-07;
        auVar61 = vandps_avx(auVar80,auVar89);
        auVar99._0_4_ = auVar61._0_4_ * 4.7683716e-07;
        auVar99._4_4_ = auVar61._4_4_ * 4.7683716e-07;
        auVar99._8_4_ = auVar61._8_4_ * 4.7683716e-07;
        auVar99._12_4_ = auVar61._12_4_ * 4.7683716e-07;
        auVar68 = vsubps_avx(auVar80,auVar99);
        auVar61 = vandps_avx(auVar69,auVar89);
        *(int *)(uVar58 + 0x40 + uVar56 * 4) = auVar70._0_4_;
        uVar6 = vextractps_avx(auVar70,1);
        *(undefined4 *)(uVar58 + 0x80 + uVar56 * 4) = uVar6;
        auVar93._0_4_ = auVar61._0_4_ * 4.7683716e-07 + auVar69._0_4_;
        auVar93._4_4_ = auVar61._4_4_ * 4.7683716e-07 + auVar69._4_4_;
        auVar93._8_4_ = auVar61._8_4_ * 4.7683716e-07 + auVar69._8_4_;
        auVar93._12_4_ = auVar61._12_4_ * 4.7683716e-07 + auVar69._12_4_;
        uVar6 = vextractps_avx(auVar70,2);
        *(undefined4 *)(uVar58 + 0xc0 + uVar56 * 4) = uVar6;
        *(float *)(uVar58 + 0x60 + uVar56 * 4) = auVar96._0_4_;
        uVar6 = vextractps_avx(auVar96,1);
        *(undefined4 *)(uVar58 + 0xa0 + uVar56 * 4) = uVar6;
        auVar61 = vsubps_avx(auVar68,auVar70);
        uVar6 = vextractps_avx(auVar96,2);
        *(undefined4 *)(uVar58 + 0xe0 + uVar56 * 4) = uVar6;
        *(int *)(uVar58 + 0x100 + uVar56 * 4) = auVar61._0_4_;
        uVar6 = vextractps_avx(auVar61,1);
        *(undefined4 *)(uVar58 + 0x140 + uVar56 * 4) = uVar6;
        auVar68 = vsubps_avx(auVar93,auVar96);
        uVar6 = vextractps_avx(auVar61,2);
        *(undefined4 *)(uVar58 + 0x180 + uVar56 * 4) = uVar6;
        *(int *)(uVar58 + 0x120 + uVar56 * 4) = auVar68._0_4_;
        uVar6 = vextractps_avx(auVar68,1);
        *(undefined4 *)(uVar58 + 0x160 + uVar56 * 4) = uVar6;
        uVar6 = vextractps_avx(auVar68,2);
        *(undefined4 *)(uVar58 + 0x1a0 + uVar56 * 4) = uVar6;
        uVar56 = uVar56 + 1;
        pfVar46 = pfVar46 + 0x18;
      } while (local_848 != uVar56);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::TriangleMesh,embree::TriangleMvMB<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::recurse();
  }
  if ((bVar59 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar43;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ab8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1ab8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ac8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ac8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1a88._8_8_;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)set;
    pSVar14 = (Split *)(in->prims).super_PrimInfoMB.object_range._begin;
    pSVar15 = (Split *)(in->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.i[2] = 0x7f800000;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.i[3] = 0x7f800000;
    local_1828._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1828._8_8_ = 0xff800000ff800000;
    piStack_1818 = (intrusive_list_node *)0x7f8000007f800000;
    piStack_1810 = (intrusive_list_node *)0x7f8000007f800000;
    local_1808._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    pvStack_1800 = (void *)0xff800000ff800000;
    if ((ulong)((long)pSVar15 - (long)pSVar14) < 0xc00) {
      isLeft.split = pSVar14;
      isLeft.vSplitPos = (vint *)pSVar15;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar15;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,(task_group_context *)in);
      cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar40 != '\0') {
        prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar49,"task cancelled");
        __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = uVar43;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aStack_18b8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         aStack_18b8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_18a8._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_18a8.i[3],local_18a8.i[2]);
    local_1a98._0_8_ = CONCAT44(aStack_1898.i[1],aStack_1898.i[0]);
    local_1a98._8_8_ = CONCAT44(aStack_1898.i[3],aStack_1898.i[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1a98._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1a98._8_8_;
  __return_storage_ptr__->dt = (in->prims).super_PrimInfoMB.time_range;
  if (local_848 != 0) {
    uVar43 = 0;
    do {
      pBVar13 = local_8c8[uVar43];
      pBVar53 = pBVar13 + 1;
      *pBVar53 = (BBox1f)((long)*pBVar53 + -1);
      if ((*pBVar53 == (BBox1f)0x0) && (BVar7 = *pBVar13, BVar7 != (BBox1f)0x0)) {
        lVar50 = *(long *)((long)BVar7 + 0x18);
        pvVar45 = *(void **)((long)BVar7 + 0x20);
        if (pvVar45 != (void *)0x0) {
          if ((ulong)(lVar50 * 0x50) < 0x1c00000) {
            alignedFree(pvVar45);
          }
          else {
            os_free(pvVar45,lVar50 * 0x50,*(bool *)((long)BVar7 + 8));
          }
        }
        if (lVar50 != 0) {
          (**(code **)**(undefined8 **)BVar7)(*(undefined8 **)BVar7,lVar50 * -0x50,1);
        }
        *(undefined8 *)((long)BVar7 + 0x10) = 0;
        *(undefined8 *)((long)BVar7 + 0x18) = 0;
        *(undefined8 *)((long)BVar7 + 0x20) = 0;
        operator_delete((void *)BVar7);
      }
      uVar43 = uVar43 + 1;
    } while (uVar43 < local_848);
  }
  if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )0x0) {
    std::
    default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
    ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                  *)&new_vector,
                 (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  *)new_vector._M_t.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }